

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

bool __thiscall
flatbuffers::go::GoGenerator::generateStructs(GoGenerator *this,string *one_file_code)

{
  pointer ppSVar1;
  StructDef *struct_def;
  bool bVar2;
  Parser *pPVar3;
  pointer ppSVar4;
  string declcode;
  
  pPVar3 = (this->super_BaseGenerator).parser_;
  ppSVar4 = (pPVar3->structs_).vec.
            super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    ppSVar1 = (pPVar3->structs_).vec.
              super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppSVar4 == ppSVar1) {
LAB_001a52c3:
      return ppSVar4 == ppSVar1;
    }
    if ((pPVar3->opts).one_file == false) {
      ResetImports(this);
    }
    declcode._M_dataplus._M_p = (pointer)&declcode.field_2;
    declcode._M_string_length = 0;
    declcode.field_2._M_local_buf[0] = '\0';
    struct_def = *ppSVar4;
    GenStruct(this,struct_def,&declcode);
    if ((((this->super_BaseGenerator).parser_)->opts).one_file == true) {
      std::__cxx11::string::append((string *)one_file_code);
    }
    else {
      bVar2 = SaveType(this,&struct_def->super_Definition,&declcode,true,false);
      if (!bVar2) {
        std::__cxx11::string::~string((string *)&declcode);
        goto LAB_001a52c3;
      }
    }
    std::__cxx11::string::~string((string *)&declcode);
    ppSVar4 = ppSVar4 + 1;
    pPVar3 = (this->super_BaseGenerator).parser_;
  } while( true );
}

Assistant:

bool generateStructs(std::string *one_file_code) {
    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      if (!parser_.opts.one_file) { ResetImports(); }
      std::string declcode;
      auto &struct_def = **it;
      GenStruct(struct_def, &declcode);
      if (parser_.opts.one_file) {
        *one_file_code += declcode;
      } else {
        if (!SaveType(struct_def, declcode, true, false)) return false;
      }
    }
    return true;
  }